

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

repcodes_t ZSTD_updateRep(U32 *rep,U32 offset,U32 ll0)

{
  uint uVar1;
  repcodes_t rVar2;
  U32 local_48;
  U32 local_44;
  U32 currentOffset;
  U32 repCode;
  U32 ll0_local;
  U32 offset_local;
  U32 *rep_local;
  U32 UStack_10;
  repcodes_t newReps;
  U32 UVar3;
  
  if (offset < 3) {
    uVar1 = offset + ll0;
    if (uVar1 == 0) {
      unique0x00012000 = *(undefined8 *)rep;
      newReps.rep[0] = rep[2];
    }
    else {
      if (uVar1 == 3) {
        local_44 = *rep - 1;
      }
      else {
        local_44 = rep[uVar1];
      }
      if (uVar1 < 2) {
        local_48 = rep[2];
      }
      else {
        local_48 = rep[1];
      }
      newReps.rep[0] = local_48;
      stack0xffffffffffffffec = CONCAT44(*rep,local_44);
    }
  }
  else {
    newReps.rep[0] = rep[1];
    stack0xffffffffffffffec = CONCAT44(*rep,offset - 2);
  }
  rVar2.rep[0] = rep_local._4_4_;
  rVar2.rep[1] = UStack_10;
  register0x00000010 = newReps.rep[0];
  return (repcodes_t)rVar2.rep;
}

Assistant:

static repcodes_t ZSTD_updateRep(U32 const rep[3], U32 const offset, U32 const ll0)
{
    repcodes_t newReps;
    if (offset >= ZSTD_REP_NUM) {  /* full offset */
        newReps.rep[2] = rep[1];
        newReps.rep[1] = rep[0];
        newReps.rep[0] = offset - ZSTD_REP_MOVE;
    } else {   /* repcode */
        U32 const repCode = offset + ll0;
        if (repCode > 0) {  /* note : if repCode==0, no change */
            U32 const currentOffset = (repCode==ZSTD_REP_NUM) ? (rep[0] - 1) : rep[repCode];
            newReps.rep[2] = (repCode >= 2) ? rep[1] : rep[2];
            newReps.rep[1] = rep[0];
            newReps.rep[0] = currentOffset;
        } else {   /* repCode == 0 */
            memcpy(&newReps, rep, sizeof(newReps));
        }
    }
    return newReps;
}